

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O0

void __thiscall QDecompressHelper::feed(QDecompressHelper *this,QByteArray *data)

{
  long lVar1;
  QDecompressHelper *in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray((QByteArray *)in_RDI,in_stack_ffffffffffffffb8);
  feed(in_RDI,in_stack_ffffffffffffffb8);
  QByteArray::~QByteArray((QByteArray *)0x2a9077);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDecompressHelper::feed(const QByteArray &data)
{
    return feed(QByteArray(data));
}